

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O1

void artifact_exists(obj *otmp,char *name,boolean mod)

{
  short sVar1;
  artifact *paVar2;
  short sVar3;
  int iVar4;
  long lVar5;
  char cVar6;
  ulong uVar7;
  
  paVar2 = artilist;
  if (((otmp != (obj *)0x0) && (*name != '\0')) && (sVar3 = artilist[1].otyp, sVar3 != 0)) {
    sVar1 = otmp->otyp;
    uVar7 = 0x40;
    lVar5 = 0x100000000;
    do {
      if ((sVar3 == sVar1) &&
         (iVar4 = strcmp(*(char **)((long)&paVar2->name + uVar7),name), iVar4 == 0)) {
        if (mod != '\0') {
          strip_oprops(otmp);
        }
        cVar6 = (char)(uVar7 >> 6);
        if (mod == '\0') {
          cVar6 = '\0';
        }
        otmp->oartifact = cVar6;
        otmp->age = 0;
        if (otmp->otyp == 0xa4) {
          otmp->spe = '\0';
        }
        artiexist[lVar5 >> 0x20] = mod;
        return;
      }
      sVar3 = *(short *)((long)&paVar2[1].otyp + uVar7);
      uVar7 = uVar7 + 0x40;
      lVar5 = lVar5 + 0x100000000;
    } while (sVar3 != 0);
  }
  return;
}

Assistant:

void artifact_exists(struct obj *otmp, const char *name, boolean mod)
{
	const struct artifact *a;

	if (otmp && *name)
	    for (a = artilist+1; a->otyp; a++)
		if (a->otyp == otmp->otyp && !strcmp(a->name, name)) {
		    int m = a - artilist;
		    if (mod) /* artifacts can't have properties */
			strip_oprops(otmp);
		    otmp->oartifact = (char)(mod ? m : 0);
		    otmp->age = 0;
		    if (otmp->otyp == RIN_INCREASE_DAMAGE)
			otmp->spe = 0;
		    artiexist[m] = mod;
		    break;
		}
	return;
}